

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_address-inl.h
# Opt level: O2

bool anon_unknown.dwarf_4583::CheckAddressPipes(uintptr_t addr,int pagesize)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_R8D;
  long lVar4;
  undefined8 uStack_140;
  SpinLockHolder local_138;
  char drainbuf [256];
  
  if (CheckAddressPipes::once.done_flag_ != 1) {
    local_138.lock_ = (SpinLock *)&CheckAddressPipes::once.lock_storage_;
    SpinLock::Lock((SpinLock *)&CheckAddressPipes::once.lock_storage_);
    if (CheckAddressPipes::once.done_flag_ != 1) {
      iVar1 = pipe(CheckAddressPipes::fds);
      if (iVar1 != 0) {
        pcVar3 = "Check failed: pipe(fds) == 0: pipe(fds)\n";
        uStack_140 = 0x28;
        goto LAB_00108c45;
      }
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
        CheckAddressPipes::anon_class_1_0_00000001::operator()::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(ulong)*(uint *)((long)CheckAddressPipes::fds + lVar4)
                   ,1,2,1,in_R8D);
        CheckAddressPipes::anon_class_1_0_00000001::operator()::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(ulong)*(uint *)((long)CheckAddressPipes::fds + lVar4)
                   ,3,4,0x800,in_R8D);
      }
      CheckAddressPipes::once.done_flag_ = 1;
    }
    SpinLockHolder::~SpinLockHolder(&local_138);
  }
  do {
    lVar4 = syscall(1,(ulong)(uint)CheckAddressPipes::fds[1],addr,1);
    iVar1 = (int)lVar4;
    if (iVar1 == 0) {
      pcVar3 = "Check failed: rv != 0: raw_write(...) == 0\n";
      uStack_140 = 0x2b;
      goto LAB_00108c45;
    }
    if (0 < iVar1) {
LAB_00108c57:
      return 0 < iVar1;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      if (*piVar2 == 0xe) goto LAB_00108c57;
      pcVar3 = "Check failed: errno == EAGAIN: write errno must be EAGAIN\n";
      uStack_140 = 0x3a;
      goto LAB_00108c45;
    }
    do {
      do {
        lVar4 = syscall(0,(ulong)(uint)CheckAddressPipes::fds[0],&local_138,0x100);
      } while (-1 < (int)lVar4);
    } while (*piVar2 == 4);
  } while (*piVar2 == 0xb);
  pcVar3 = "Check failed: errno == EAGAIN: read errno must be EAGAIN\n";
  uStack_140 = 0x39;
LAB_00108c45:
  syscall(1,2,pcVar3,uStack_140);
  abort();
}

Assistant:

bool CheckAddress(uintptr_t addr, int pagesize) {
  static tcmalloc::TrivialOnce once;
  static int fds[2];

  once.RunOnce([] () {
    RAW_CHECK(pipe(fds) == 0, "pipe(fds)");

    auto add_flag = [] (int fd, int get, int set, int the_flag) {
      int flags = fcntl(fd, get, 0);
      RAW_CHECK(flags >= 0, "fcntl get");
      flags |= the_flag;
      RAW_CHECK(fcntl(fd, set, flags) == 0, "fcntl set");
    };

    for (int i = 0; i < 2; i++) {
      add_flag(fds[i], F_GETFD, F_SETFD, FD_CLOEXEC);
      add_flag(fds[i], F_GETFL, F_SETFL, O_NONBLOCK);
    }
  });

  do {
    int rv = raw_write(fds[1], reinterpret_cast<void*>(addr), 1);
    RAW_CHECK(rv != 0, "raw_write(...) == 0");
    if (rv > 0) {
      return true;
    }
    if (errno == EFAULT) {
      return false;
    }

    RAW_CHECK(errno == EAGAIN, "write errno must be EAGAIN");

    char drainbuf[256];
    do {
      rv = raw_read(fds[0], drainbuf, sizeof(drainbuf));
      if (rv < 0 && errno != EINTR) {
        RAW_CHECK(errno == EAGAIN, "read errno must be EAGAIN");
        break;
      }
      // read succeeded or we got EINTR
    } while (true);
  } while (true);

  return false;
}